

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

Violation mp::
          ComputeViolation<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::TanhId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanhId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  bool bVar2;
  CtxVal CVar3;
  double *pdVar4;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  FunctionalConstraint *in_RDI;
  double dVar5;
  double dVar6;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this;
  double viol;
  int resvar;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff98;
  int iVar7;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffb8;
  int i;
  Context local_34;
  double local_30;
  int local_24;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *local_20;
  FunctionalConstraint *local_18;
  double local_10;
  double local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_24 = FunctionalConstraint::GetResultVar(in_RDI);
  bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::recomp_vals(local_20);
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (bVar2) {
    dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffffa0,iVar7);
    dVar6 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::raw
                      (in_stack_ffffffffffffffa0,(int)((ulong)dVar5 >> 0x20));
    this = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)ABS(dVar5 - dVar6);
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)0x0,i);
    iVar7 = (int)((ulong)dVar5 >> 0x20);
    pdVar4 = std::max<double>((double *)&stack0xffffffffffffffc0,(double *)&stack0xffffffffffffffb8)
    ;
    local_10 = (double)this + *pdVar4;
    local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[](this,iVar7);
  }
  else {
    dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffffa0,iVar7);
    local_30 = ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                         ((TanhConstraint *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    local_30 = dVar5 - local_30;
    local_34 = FunctionalConstraint::GetContext(local_18);
    CVar3 = Context::GetValue(&local_34);
    if (CVar3 == CTX_POS) {
      local_10 = local_30;
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else if (CVar3 == CTX_NEG) {
      local_10 = -local_30;
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else if (CVar3 == CTX_MIX) {
      local_10 = ABS(local_30);
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else {
      local_10 = INFINITY;
      local_8 = 0.0;
    }
  }
  VVar1.valX_ = local_8;
  VVar1.viol_ = local_10;
  return VVar1;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}